

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.cc
# Opt level: O0

void brotli::CopyLiteralsToByteArray
               (Command *cmds,size_t num_commands,uint8_t *data,size_t offset,size_t mask,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *literals)

{
  size_t __n;
  reference pvVar1;
  size_t head_size;
  size_t insert_len;
  size_t i_1;
  size_t from_pos;
  size_t pos;
  size_t i;
  size_t total_length;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *literals_local;
  size_t mask_local;
  size_t offset_local;
  uint8_t *data_local;
  size_t num_commands_local;
  Command *cmds_local;
  
  i = 0;
  for (pos = 0; pos < num_commands; pos = pos + 1) {
    i = cmds[pos].insert_len_ + i;
  }
  if (i != 0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(literals,i);
    from_pos = 0;
    i_1 = offset & mask;
    for (insert_len = 0; insert_len < num_commands && from_pos < i; insert_len = insert_len + 1) {
      head_size = (size_t)cmds[insert_len].insert_len_;
      if (mask < i_1 + head_size) {
        __n = (mask + 1) - i_1;
        pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (literals,from_pos);
        memcpy(pvVar1,data + i_1,__n);
        i_1 = 0;
        from_pos = __n + from_pos;
        head_size = head_size - __n;
      }
      if (head_size != 0) {
        pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (literals,from_pos);
        memcpy(pvVar1,data + i_1,head_size);
        from_pos = head_size + from_pos;
      }
      i_1 = i_1 + head_size + (ulong)cmds[insert_len].copy_len_ & mask;
    }
  }
  return;
}

Assistant:

void CopyLiteralsToByteArray(const Command* cmds,
                             const size_t num_commands,
                             const uint8_t* data,
                             const size_t offset,
                             const size_t mask,
                             std::vector<uint8_t>* literals) {
  // Count how many we have.
  size_t total_length = 0;
  for (size_t i = 0; i < num_commands; ++i) {
    total_length += cmds[i].insert_len_;
  }
  if (total_length == 0) {
    return;
  }

  // Allocate.
  literals->resize(total_length);

  // Loop again, and copy this time.
  size_t pos = 0;
  size_t from_pos = offset & mask;
  for (size_t i = 0; i < num_commands && pos < total_length; ++i) {
    size_t insert_len = cmds[i].insert_len_;
    if (from_pos + insert_len > mask) {
      size_t head_size = mask + 1 - from_pos;
      memcpy(&(*literals)[pos], data + from_pos, head_size);
      from_pos = 0;
      pos += head_size;
      insert_len -= head_size;
    }
    if (insert_len > 0) {
      memcpy(&(*literals)[pos], data + from_pos, insert_len);
      pos += insert_len;
    }
    from_pos = (from_pos + insert_len + cmds[i].copy_len_) & mask;
  }
}